

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_message_lite.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::java::ImmutableMessageLiteGenerator::GenerateDynamicMethodVisit
          (ImmutableMessageLiteGenerator *this,Printer *printer)

{
  FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldLiteGenerator> *this_00;
  long lVar1;
  FieldDescriptor *field;
  bool bVar2;
  int iVar3;
  ImmutableFieldLiteGenerator *pIVar4;
  Descriptor *pDVar5;
  OneofGeneratorInfo *pOVar6;
  ulong uVar7;
  ulong extraout_RDX;
  int i_1;
  int iVar8;
  OneofDescriptor *oneof;
  int i;
  long lVar9;
  java *this_01;
  int j;
  long lVar10;
  long lVar11;
  string local_50;
  
  ClassNameResolver::GetImmutableClassName<google::protobuf::Descriptor>
            (&local_50,this->name_resolver_,(this->super_MessageGenerator).descriptor_);
  io::Printer::Print(printer,
                     "Visitor visitor = (Visitor) arg0;\n$classname$ other = ($classname$) arg1;\n",
                     "classname",&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  this_00 = &this->field_generators_;
  lVar10 = 0;
  for (lVar9 = 0; pDVar5 = (this->super_MessageGenerator).descriptor_,
      lVar9 < *(int *)(pDVar5 + 0x2c); lVar9 = lVar9 + 1) {
    if (*(long *)(*(long *)(pDVar5 + 0x30) + 0x60 + lVar10) == 0) {
      pIVar4 = FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldLiteGenerator>::get
                         (this_00,(FieldDescriptor *)(*(long *)(pDVar5 + 0x30) + lVar10));
      (*pIVar4->_vptr_ImmutableFieldLiteGenerator[8])(pIVar4,printer);
    }
    lVar10 = lVar10 + 0xa8;
  }
  for (lVar9 = 0; lVar9 < *(int *)(pDVar5 + 0x38); lVar9 = lVar9 + 1) {
    lVar10 = lVar9 * 0x30;
    pOVar6 = Context::GetOneofGeneratorInfo
                       (this->context_,(OneofDescriptor *)(*(long *)(pDVar5 + 0x40) + lVar10));
    io::Printer::Print(printer,"switch (other.get$oneof_capitalized_name$Case()) {\n",
                       "oneof_capitalized_name",&pOVar6->capitalized_name);
    io::Printer::Indent(printer);
    for (lVar11 = 0; lVar1 = *(long *)((this->super_MessageGenerator).descriptor_ + 0x40),
        oneof = (OneofDescriptor *)(lVar1 + lVar10), lVar11 < *(int *)(lVar1 + 0x1c + lVar10);
        lVar11 = lVar11 + 1) {
      field = *(FieldDescriptor **)(*(long *)(oneof + 0x20) + lVar11 * 8);
      ToUpper(&local_50,*(string **)field);
      io::Printer::Print(printer,"case $field_name$: {\n","field_name",&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      io::Printer::Indent(printer);
      pIVar4 = FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldLiteGenerator>::get
                         (this_00,field);
      (*pIVar4->_vptr_ImmutableFieldLiteGenerator[8])(pIVar4,printer);
      io::Printer::Print(printer,"break;\n");
      io::Printer::Outdent(printer);
      io::Printer::Print(printer,"}\n");
    }
    pOVar6 = Context::GetOneofGeneratorInfo(this->context_,oneof);
    ToUpper(&local_50,&pOVar6->name);
    pOVar6 = Context::GetOneofGeneratorInfo
                       (this->context_,
                        (OneofDescriptor *)
                        (lVar10 + *(long *)((this->super_MessageGenerator).descriptor_ + 0x40)));
    io::Printer::Print(printer,
                       "case $cap_oneof_name$_NOT_SET: {\n  visitor.visitOneofNotSet($oneof_name$Case_ != 0);\n  break;\n}\n"
                       ,"cap_oneof_name",&local_50,"oneof_name",&pOVar6->name);
    std::__cxx11::string::~string((string *)&local_50);
    io::Printer::Outdent(printer);
    io::Printer::Print(printer,"}\n");
    pDVar5 = (this->super_MessageGenerator).descriptor_;
  }
  io::Printer::Print(printer,
                     "if (visitor == com.google.protobuf.GeneratedMessageLite.MergeFromVisitor\n    .INSTANCE) {\n"
                    );
  io::Printer::Indent(printer);
  lVar10 = 0;
  for (lVar9 = 0; pDVar5 = (this->super_MessageGenerator).descriptor_,
      lVar9 < *(int *)(pDVar5 + 0x38); lVar9 = lVar9 + 1) {
    pOVar6 = Context::GetOneofGeneratorInfo
                       (this->context_,(OneofDescriptor *)(*(long *)(pDVar5 + 0x40) + lVar10));
    io::Printer::Print(printer,
                       "if (other.$oneof_name$Case_ != 0) {\n  $oneof_name$Case_ = other.$oneof_name$Case_;\n}\n"
                       ,"oneof_name",&pOVar6->name);
    lVar10 = lVar10 + 0x30;
  }
  bVar2 = anon_unknown_18::GenerateHasBits(pDVar5);
  if (bVar2) {
    lVar10 = 0;
    iVar8 = 0;
    for (lVar9 = 0; pDVar5 = (this->super_MessageGenerator).descriptor_,
        lVar9 < *(int *)(pDVar5 + 0x2c); lVar9 = lVar9 + 1) {
      pIVar4 = FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldLiteGenerator>::get
                         (this_00,(FieldDescriptor *)(*(long *)(pDVar5 + 0x30) + lVar10));
      iVar3 = (*pIVar4->_vptr_ImmutableFieldLiteGenerator[2])(pIVar4);
      iVar8 = iVar8 + iVar3;
      lVar10 = lVar10 + 0xa8;
    }
    iVar3 = (iVar8 + 0x1f) / 0x20;
    uVar7 = (long)(iVar8 + 0x1f) % 0x20 & 0xffffffff;
    this_01 = (java *)0x0;
    if (iVar3 < 1) {
      iVar3 = 0;
    }
    for (; iVar3 != (int)this_01; this_01 = (java *)(ulong)((int)this_01 + 1)) {
      GetBitFieldName_abi_cxx11_(&local_50,this_01,(int)uVar7);
      io::Printer::Print(printer,"$bit_field_name$ |= other.$bit_field_name$;\n","bit_field_name",
                         &local_50);
      std::__cxx11::string::~string((string *)&local_50);
      uVar7 = extraout_RDX;
    }
  }
  io::Printer::Outdent(printer);
  io::Printer::Print(printer,"}\n");
  io::Printer::Print(printer,"return this;\n");
  return;
}

Assistant:

void ImmutableMessageLiteGenerator::GenerateDynamicMethodVisit(
    io::Printer* printer) {
  printer->Print(
    "Visitor visitor = (Visitor) arg0;\n"
    "$classname$ other = ($classname$) arg1;\n",
    "classname", name_resolver_->GetImmutableClassName(descriptor_));

  for (int i = 0; i < descriptor_->field_count(); i++) {
    if (!descriptor_->field(i)->containing_oneof()) {
      field_generators_.get(
          descriptor_->field(i)).GenerateVisitCode(printer);
    }
  }

  // Merge oneof fields.
  for (int i = 0; i < descriptor_->oneof_decl_count(); ++i) {
    printer->Print(
      "switch (other.get$oneof_capitalized_name$Case()) {\n",
      "oneof_capitalized_name",
      context_->GetOneofGeneratorInfo(
          descriptor_->oneof_decl(i))->capitalized_name);
    printer->Indent();
    for (int j = 0; j < descriptor_->oneof_decl(i)->field_count(); j++) {
      const FieldDescriptor* field = descriptor_->oneof_decl(i)->field(j);
      printer->Print(
        "case $field_name$: {\n",
        "field_name",
        ToUpper(field->name()));
      printer->Indent();
      field_generators_.get(field).GenerateVisitCode(printer);
      printer->Print(
          "break;\n");
      printer->Outdent();
      printer->Print(
          "}\n");
    }
    printer->Print(
      "case $cap_oneof_name$_NOT_SET: {\n"
      "  visitor.visitOneofNotSet($oneof_name$Case_ != 0);\n"
      "  break;\n"
      "}\n",
      "cap_oneof_name",
      ToUpper(context_->GetOneofGeneratorInfo(
          descriptor_->oneof_decl(i))->name),
      "oneof_name",
      context_->GetOneofGeneratorInfo(
          descriptor_->oneof_decl(i))->name);
    printer->Outdent();
    printer->Print(
      "}\n");
  }

  printer->Print(
    "if (visitor == com.google.protobuf.GeneratedMessageLite.MergeFromVisitor\n"
    "    .INSTANCE) {\n");
  printer->Indent();
  for (int i = 0; i < descriptor_->oneof_decl_count(); ++i) {
    const OneofDescriptor* field = descriptor_->oneof_decl(i);
    printer->Print(
      "if (other.$oneof_name$Case_ != 0) {\n"
      "  $oneof_name$Case_ = other.$oneof_name$Case_;\n"
      "}\n",
      "oneof_name", context_->GetOneofGeneratorInfo(field)->name);
  }

  if (GenerateHasBits(descriptor_)) {
    // Integers for bit fields.
    int totalBits = 0;
    for (int i = 0; i < descriptor_->field_count(); i++) {
      totalBits += field_generators_.get(descriptor_->field(i))
          .GetNumBitsForMessage();
    }
    int totalInts = (totalBits + 31) / 32;

    for (int i = 0; i < totalInts; i++) {
      printer->Print(
        "$bit_field_name$ |= other.$bit_field_name$;\n",
        "bit_field_name", GetBitFieldName(i));
    }
  }
  printer->Outdent();
  printer->Print(
    "}\n");


  printer->Print(
    "return this;\n");
}